

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O0

void __thiscall PluginFverb::PluginFverb(PluginFverb *this)

{
  Fverb *this_00;
  vector<float,_std::allocator<float>_> *local_158;
  vector<float,_std::allocator<float>_> *local_128;
  vector<float,_std::allocator<float>_> *local_108;
  undefined1 local_d0 [4];
  float tau;
  Parameter param;
  uint p;
  PluginFverb *this_local;
  
  DISTRHO::Plugin::Plugin(&this->super_Plugin,0xf,0,0);
  (this->super_Plugin)._vptr_Plugin = (_func_int **)&PTR__PluginFverb_00121cb0;
  this_00 = (Fverb *)operator_new(8);
  Fverb::Fverb(this_00);
  std::unique_ptr<Fverb,std::default_delete<Fverb>>::unique_ptr<std::default_delete<Fverb>,void>
            ((unique_ptr<Fverb,std::default_delete<Fverb>> *)&this->fDsp,this_00);
  this->fBypass = 0.0;
  this->fWasBypass = false;
  this->fVintage = false;
  this->fWasVintage = false;
  LinearSmoother::LinearSmoother(&this->fDry);
  LinearSmoother::LinearSmoother(&this->fWet);
  WDL_Resampler::WDL_Resampler(&this->fDownsampler);
  WDL_Resampler::WDL_Resampler(&this->fUpsampler);
  memset(&this->fLastDspOutputs,0,8);
  local_108 = this->fInputKeep;
  do {
    std::vector<float,_std::allocator<float>_>::vector(local_108);
    local_108 = local_108 + 1;
  } while (local_108 != &this->fDownsamplerOut);
  std::vector<float,_std::allocator<float>_>::vector(&this->fDownsamplerOut);
  std::vector<float,_std::allocator<float>_>::vector(&this->fUpsamplerOut);
  local_128 = this->fDspIn;
  do {
    std::vector<float,_std::allocator<float>_>::vector(local_128);
    local_128 = local_128 + 1;
  } while (local_128 != this->fDspOut);
  local_158 = this->fDspOut;
  do {
    std::vector<float,_std::allocator<float>_>::vector(local_158);
    local_158 = local_158 + 1;
  } while ((PluginFverb *)local_158 != this + 1);
  for (param.groupId = 0; param.groupId < 0xf; param.groupId = param.groupId + 1) {
    DISTRHO::Parameter::Parameter((Parameter *)local_d0);
    (*(this->super_Plugin)._vptr_Plugin[0xb])(this,(ulong)param.groupId,(Parameter *)local_d0);
    (*(this->super_Plugin)._vptr_Plugin[0xe])
              ((ulong)(uint)param.description._16_4_,this,(ulong)param.groupId);
    DISTRHO::Parameter::~Parameter((Parameter *)local_d0);
  }
  LinearSmoother::setTimeConstant(&this->fDry,0.005);
  LinearSmoother::setTimeConstant(&this->fWet,0.005);
  DISTRHO::Plugin::getSampleRate(&this->super_Plugin);
  (*(this->super_Plugin)._vptr_Plugin[0x13])();
  return;
}

Assistant:

PluginFverb::PluginFverb()
    : Plugin(kNumParameters, 0, 0),
      fDsp(new Fverb)
{
    for (unsigned p = 0; p < kNumParameters; ++p) {
        Parameter param;
        initParameter(p, param);
        setParameterValue(p, param.ranges.def);
    }

    float tau = 5e-3;
    fDry.setTimeConstant(tau);
    fWet.setTimeConstant(tau);

    sampleRateChanged(getSampleRate());
}